

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

uchar FSE_decodeSymbolFast(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD)

{
  uint uVar1;
  size_t sVar2;
  size_t lowBits;
  ushort uStack_1c;
  uchar uStack_1a;
  BYTE symbol;
  U32 nbBits;
  FSE_decode_t DInfo;
  BIT_DStream_t *bitD_local;
  FSE_DState_t *DStatePtr_local;
  
  uVar1 = *(uint *)((long)DStatePtr->table + DStatePtr->state * 4);
  uStack_1a = (uchar)(uVar1 >> 0x10);
  sVar2 = BIT_readBitsFast(bitD,uVar1 >> 0x18);
  uStack_1c = (ushort)uVar1;
  DStatePtr->state = uStack_1c + sVar2;
  return uStack_1a;
}

Assistant:

MEM_STATIC BYTE FSE_decodeSymbolFast(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD)
{
    FSE_decode_t const DInfo = ((const FSE_decode_t*)(DStatePtr->table))[DStatePtr->state];
    U32 const nbBits = DInfo.nbBits;
    BYTE const symbol = DInfo.symbol;
    size_t const lowBits = BIT_readBitsFast(bitD, nbBits);

    DStatePtr->state = DInfo.newState + lowBits;
    return symbol;
}